

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogSerializer::~WriteAheadLogSerializer(WriteAheadLogSerializer *this)

{
  BinarySerializer::~BinarySerializer(&this->serializer);
  ::std::__cxx11::string::~string((string *)&(this->options).serialization_compatibility);
  ChecksumWriter::~ChecksumWriter(&this->checksum_writer);
  return;
}

Assistant:

WriteAheadLogSerializer(WriteAheadLog &wal, WALType wal_type)
	    : checksum_writer(wal), serializer(checksum_writer, SerializationOptions(wal.GetDatabase())) {
		if (!wal.Initialized()) {
			wal.Initialize();
		}
		// write a version marker if none has been written yet
		wal.WriteVersion();
		serializer.Begin();
		serializer.WriteProperty(100, "wal_type", wal_type);
	}